

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.h
# Opt level: O0

rgba_vec_t * sfc::to_rgba(rgba_vec_t *__return_storage_ptr__,channel_vec_t *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_type sVar5;
  runtime_error *this;
  byte *pbVar6;
  reference pvVar7;
  uint local_2c;
  allocator<unsigned_int> local_26;
  undefined1 local_25;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  channel_vec_t *data_local;
  rgba_vec_t *v;
  
  local_18 = data;
  data_local = (channel_vec_t *)__return_storage_ptr__;
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(data);
  if ((sVar5 & 3) == 0) {
    local_25 = 0;
    sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_18);
    std::allocator<unsigned_int>::allocator(&local_26);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (__return_storage_ptr__,sVar5 >> 2,&local_26);
    std::allocator<unsigned_int>::~allocator(&local_26);
    for (local_2c = 0;
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          (__return_storage_ptr__), local_2c < sVar5; local_2c = local_2c + 1) {
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,(ulong)(local_2c << 2));
      bVar1 = *pbVar6;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,(ulong)(local_2c * 4 + 1));
      bVar2 = *pbVar6;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,(ulong)(local_2c * 4 + 2));
      bVar3 = *pbVar6;
      pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,(ulong)(local_2c * 4 + 3));
      bVar4 = *pbVar6;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (__return_storage_ptr__,(ulong)local_2c);
      *pvVar7 = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 + (uint)bVar4 * 0x1000000;
    }
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"RGBA vector size not a multiple of 4");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline rgba_vec_t to_rgba(const channel_vec_t& data) {
  if (data.size() % 4 != 0)
    throw std::runtime_error("RGBA vector size not a multiple of 4");
  rgba_vec_t v(data.size() >> 2);
  for (unsigned i = 0; i < v.size(); ++i) {
    v[i] = (data[i * 4]) + (data[(i * 4) + 1] << 8) + (data[(i * 4) + 2] << 16) + (data[(i * 4) + 3] << 24);
  }
  return v;
}